

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O2

void read_dist(char *path,char *name,distribution *target)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  set_member *psVar4;
  size_t sVar5;
  undefined8 uVar6;
  bool bVar7;
  long local_258;
  long weight;
  set_member *local_240;
  char line [256];
  char token [256];
  
  if (d_path == (char *)0x0) {
    pcVar2 = env_config("DSS_CONFIG",".");
    sprintf(line,"%s%c%s",pcVar2,0x2f,path);
    __stream = fopen64(line,"r");
    if (__stream != (FILE *)0x0) goto LAB_00102ccd;
    pcVar2 = line;
    uVar6 = 0x114;
  }
  else {
    __stream = fopen64(d_path,"r");
    if (__stream != (FILE *)0x0) {
LAB_00102ccd:
      local_258 = 0;
      bVar7 = false;
LAB_00102ce6:
      pcVar2 = fgets(line,0x100,__stream);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = strchr(line,10);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
        pcVar2 = strchr(line,0x23);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
        if (line[0] != '\0') {
          if (bVar7) {
            lVar3 = dssncasecmp(line,"END",3);
            if (lVar3 == 0) goto LAB_00102e7e;
            iVar1 = __isoc99_sscanf(line,"%[^|]|%ld",token,&weight);
            bVar7 = true;
            if (iVar1 == 2) {
              lVar3 = dsscasecmp(token,"count");
              if (lVar3 == 0) {
                target->count = (int)weight;
                psVar4 = (set_member *)malloc(CONCAT44(weight._4_4_,(int)weight) << 4);
                target->list = psVar4;
                if (psVar4 != (set_member *)0x0) {
                  target->max = 0;
                  bVar7 = true;
                  goto LAB_00102ce6;
                }
                uVar6 = 0x13f;
              }
              else {
                sVar5 = strlen(token);
                pcVar2 = (char *)malloc((long)((int)sVar5 + 1));
                local_240 = target->list;
                local_240[local_258].text = pcVar2;
                if (pcVar2 != (char *)0x0) {
                  strcpy(pcVar2,token);
                  iVar1 = target->max + (int)weight;
                  target->max = iVar1;
                  local_240[local_258].weight = (long)iVar1;
                  local_258 = local_258 + 1;
                  bVar7 = true;
                  goto LAB_00102ce6;
                }
                uVar6 = 0x145;
              }
              fprintf(_stderr,"Malloc failed at %s:%d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/bm_utils.c"
                      ,uVar6);
              goto LAB_00102f0f;
            }
          }
          else {
            pcVar2 = strtok(line,"\n\t ");
            lVar3 = dsscasecmp(pcVar2,"BEGIN");
            bVar7 = false;
            if (lVar3 == 0) {
              pcVar2 = strtok((char *)0x0,"\n\t ");
              lVar3 = dsscasecmp(pcVar2,name);
              bVar7 = lVar3 == 0;
            }
          }
        }
        goto LAB_00102ce6;
      }
      if (local_258 == target->count) {
        target->permute = (long *)0x0;
LAB_00102e7e:
        fclose(__stream);
        return;
      }
      fprintf(_stderr,"Read error on dist \'%s\'\n",name);
      fclose(__stream);
      goto LAB_00102f0f;
    }
    uVar6 = 0x119;
    pcVar2 = d_path;
  }
  fprintf(_stderr,"Open failed for %s at %s:%d\n",pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/bm_utils.c"
          ,uVar6);
LAB_00102f0f:
  exit(1);
}

Assistant:

void
read_dist(char *path, char *name, distribution *target)
{
FILE     *fp;
char      line[256],
         token[256],
        *c;
long      weight,
         count = 0,
         name_set = 0;

    if (d_path == NULL)
		{
		sprintf(line, "%s%c%s", 
			env_config(CONFIG_TAG, CONFIG_DFLT), PATH_SEP, path);
		fp = fopen(line, "r");
		OPEN_CHECK(fp, line);
		}
	else
		{
		fp = fopen(d_path, "r");
		OPEN_CHECK(fp, d_path);
		}
    while (fgets(line, sizeof(line), fp) != NULL)
        {
        if ((c = strchr(line, '\n')) != NULL)
            *c = '\0';
        if ((c = strchr(line, '#')) != NULL)
            *c = '\0';
        if (*line == '\0')
            continue;

        if (!name_set)
            {
            if (dsscasecmp(strtok(line, "\n\t "), "BEGIN"))
                continue;
            if (dsscasecmp(strtok(NULL, "\n\t "), name))
                continue;
            name_set = 1;
            continue;
            }
        else
            {
            if (!dssncasecmp(line, "END", 3))
                {
                fclose(fp);
                return;
                }
            }

        if (sscanf(line, "%[^|]|%ld", token, &weight) != 2)
            continue;

        if (!dsscasecmp(token, "count"))
            {
            target->count = weight;
            target->list =
                (set_member *)
                    malloc((size_t)(weight * sizeof(set_member)));
            MALLOC_CHECK(target->list);
            target->max = 0;
            continue;
            }
        target->list[count].text =
            (char *) malloc((size_t)((int)strlen(token) + 1));
        MALLOC_CHECK(target->list[count].text);
        strcpy(target->list[count].text, token);
        target->max += weight;
        target->list[count].weight = target->max;

        count += 1;
        } /* while fgets() */

    if (count != target->count)
        {
        fprintf(stderr, "Read error on dist '%s'\n", name);
        fclose(fp);
        exit(1);
        }
	target->permute = (long *)NULL;
    fclose(fp);
    return;
}